

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O2

void __thiscall absl::time_internal::cctz::time_zone::Impl::Impl(Impl *this,string *name)

{
  std::__cxx11::string::string((string *)this,name);
  TimeZoneIf::Load((TimeZoneIf *)&this->zone_,&this->name_);
  return;
}

Assistant:

time_zone::Impl::Impl(const std::string& name)
    : name_(name), zone_(TimeZoneIf::Load(name_)) {}